

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

void __thiscall llvm::yaml::SequenceNode::increment(SequenceNode *this)

{
  SequenceType SVar1;
  pointer pcVar2;
  TokenKind TVar3;
  iterator Position;
  Token *pTVar4;
  Node *pNVar5;
  char *Str;
  Token T;
  long *local_170 [2];
  long local_160 [3];
  Twine local_148;
  Token local_130;
  Token local_f8;
  Token local_c0;
  Token local_88;
  Token local_50;
  
  if (*(char *)(*(long *)&((((this->super_Node).Doc)->_M_t).
                           super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                           .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                          stream->scanner + 0x4a) == '\x01') {
    this->IsAtEnd = true;
    this->CurrentEntry = (Node *)0x0;
    return;
  }
  if (this->CurrentEntry != (Node *)0x0) {
    (*this->CurrentEntry->_vptr_Node[1])();
  }
  pTVar4 = Scanner::peekNext(*(Scanner **)
                              &((((this->super_Node).Doc)->_M_t).
                                super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)
                               ->stream->scanner);
  TVar3 = pTVar4->Kind;
  Position = (pTVar4->Range).Data;
  pcVar2 = (pTVar4->Value)._M_dataplus._M_p;
  local_170[0] = local_160;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_170,pcVar2,pcVar2 + (pTVar4->Value)._M_string_length);
  SVar1 = this->SeqType;
  if (SVar1 == ST_Indentless) {
    if (TVar3 == TK_BlockEntry) {
      Scanner::getNext(&local_c0,
                       *(Scanner **)
                        &((((this->super_Node).Doc)->_M_t).
                          super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                          .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                         stream->scanner);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.Value._M_dataplus._M_p != &local_c0.Value.field_2) {
LAB_0018e498:
        operator_delete(local_c0.Value._M_dataplus._M_p,
                        local_c0.Value.field_2._M_allocated_capacity + 1);
      }
LAB_0018e4a0:
      pNVar5 = Document::parseBlockNode
                         ((((this->super_Node).Doc)->_M_t).
                          super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                          .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl);
      this->CurrentEntry = pNVar5;
      if (pNVar5 != (Node *)0x0) goto LAB_0018e5f8;
    }
    goto switchD_0018e44a_caseD_0;
  }
  if (SVar1 != ST_Flow) {
    if (SVar1 != ST_Block) goto LAB_0018e5f8;
    if (TVar3 != TK_Error) {
      if (TVar3 != TK_BlockEnd) {
        if (TVar3 == TK_BlockEntry) {
          Scanner::getNext(&local_50,
                           *(Scanner **)
                            &((((this->super_Node).Doc)->_M_t).
                              super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                              .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                             stream->scanner);
          local_c0.Value.field_2._M_allocated_capacity =
               local_50.Value.field_2._M_allocated_capacity;
          local_c0.Value._M_dataplus._M_p = local_50.Value._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50.Value._M_dataplus._M_p != &local_50.Value.field_2) goto LAB_0018e498;
          goto LAB_0018e4a0;
        }
        Str = "Unexpected token. Expected Block Entry or Block End.";
        goto LAB_0018e5c5;
      }
      Scanner::getNext(&local_88,
                       *(Scanner **)
                        &((((this->super_Node).Doc)->_M_t).
                          super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                          .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                         stream->scanner);
      local_130.Value.field_2._M_allocated_capacity = local_88.Value.field_2._M_allocated_capacity;
      local_130.Value._M_dataplus._M_p = local_88.Value._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.Value._M_dataplus._M_p != &local_88.Value.field_2) goto LAB_0018e53d;
    }
    goto switchD_0018e44a_caseD_0;
  }
  switch(TVar3) {
  case TK_Error:
    break;
  default:
    if (this->WasPreviousTokenFlowEntry != false) {
      pNVar5 = Document::parseBlockNode
                         ((((this->super_Node).Doc)->_M_t).
                          super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                          .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl);
      this->CurrentEntry = pNVar5;
      if (pNVar5 == (Node *)0x0) {
        this->IsAtEnd = true;
      }
      this->WasPreviousTokenFlowEntry = false;
      goto LAB_0018e5f8;
    }
    Str = "Expected , between entries!";
    goto LAB_0018e5c5;
  case TK_StreamEnd:
  case TK_DocumentStart:
  case TK_DocumentEnd:
    Str = "Could not find closing ]!";
LAB_0018e5c5:
    Twine::Twine(&local_148,Str);
    Scanner::setError(*(Scanner **)
                       &((((this->super_Node).Doc)->_M_t).
                         super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                         .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->stream
                        ->scanner,&local_148,Position);
    break;
  case TK_FlowEntry:
    Scanner::getNext(&local_f8,
                     *(Scanner **)
                      &((((this->super_Node).Doc)->_M_t).
                        super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                        .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->stream
                       ->scanner);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.Value._M_dataplus._M_p != &local_f8.Value.field_2) {
      operator_delete(local_f8.Value._M_dataplus._M_p,
                      local_f8.Value.field_2._M_allocated_capacity + 1);
    }
    this->WasPreviousTokenFlowEntry = true;
    increment(this);
    goto LAB_0018e5f8;
  case TK_FlowSequenceEnd:
    Scanner::getNext(&local_130,
                     *(Scanner **)
                      &((((this->super_Node).Doc)->_M_t).
                        super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                        .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->stream
                       ->scanner);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.Value._M_dataplus._M_p != &local_130.Value.field_2) {
LAB_0018e53d:
      operator_delete(local_130.Value._M_dataplus._M_p,
                      local_130.Value.field_2._M_allocated_capacity + 1);
    }
  }
switchD_0018e44a_caseD_0:
  this->IsAtEnd = true;
  this->CurrentEntry = (Node *)0x0;
LAB_0018e5f8:
  if (local_170[0] != local_160) {
    operator_delete(local_170[0],local_160[0] + 1);
  }
  return;
}

Assistant:

void SequenceNode::increment() {
  if (failed()) {
    IsAtEnd = true;
    CurrentEntry = nullptr;
    return;
  }
  if (CurrentEntry)
    CurrentEntry->skip();
  Token T = peekNext();
  if (SeqType == ST_Block) {
    switch (T.Kind) {
    case Token::TK_BlockEntry:
      getNext();
      CurrentEntry = parseBlockNode();
      if (!CurrentEntry) { // An error occurred.
        IsAtEnd = true;
        CurrentEntry = nullptr;
      }
      break;
    case Token::TK_BlockEnd:
      getNext();
      IsAtEnd = true;
      CurrentEntry = nullptr;
      break;
    default:
      setError( "Unexpected token. Expected Block Entry or Block End."
              , T);
      LLVM_FALLTHROUGH;
    case Token::TK_Error:
      IsAtEnd = true;
      CurrentEntry = nullptr;
    }
  } else if (SeqType == ST_Indentless) {
    switch (T.Kind) {
    case Token::TK_BlockEntry:
      getNext();
      CurrentEntry = parseBlockNode();
      if (!CurrentEntry) { // An error occurred.
        IsAtEnd = true;
        CurrentEntry = nullptr;
      }
      break;
    default:
    case Token::TK_Error:
      IsAtEnd = true;
      CurrentEntry = nullptr;
    }
  } else if (SeqType == ST_Flow) {
    switch (T.Kind) {
    case Token::TK_FlowEntry:
      // Eat the flow entry and recurse.
      getNext();
      WasPreviousTokenFlowEntry = true;
      return increment();
    case Token::TK_FlowSequenceEnd:
      getNext();
      LLVM_FALLTHROUGH;
    case Token::TK_Error:
      // Set this to end iterator.
      IsAtEnd = true;
      CurrentEntry = nullptr;
      break;
    case Token::TK_StreamEnd:
    case Token::TK_DocumentEnd:
    case Token::TK_DocumentStart:
      setError("Could not find closing ]!", T);
      // Set this to end iterator.
      IsAtEnd = true;
      CurrentEntry = nullptr;
      break;
    default:
      if (!WasPreviousTokenFlowEntry) {
        setError("Expected , between entries!", T);
        IsAtEnd = true;
        CurrentEntry = nullptr;
        break;
      }
      // Otherwise it must be a flow entry.
      CurrentEntry = parseBlockNode();
      if (!CurrentEntry) {
        IsAtEnd = true;
      }
      WasPreviousTokenFlowEntry = false;
      break;
    }
  }
}